

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

BLOCK_SIZE get_partition_subsize(BLOCK_SIZE bsize,PARTITION_TYPE partition)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  
  bVar2 = bsize - BLOCK_16X16;
  BVar1 = BLOCK_INVALID;
  if ((bVar2 < 10) && ((0x249U >> (bVar2 & 0x1f) & 1) != 0)) {
    BVar1 = subsize_lookup[partition][*(long *)(&DAT_00463960 + (ulong)bVar2 * 8)];
  }
  return BVar1;
}

Assistant:

static inline BLOCK_SIZE get_partition_subsize(BLOCK_SIZE bsize,
                                               PARTITION_TYPE partition) {
  if (partition == PARTITION_INVALID) {
    return BLOCK_INVALID;
  } else {
    const int sqr_bsize_idx = get_sqr_bsize_idx(bsize);
    return sqr_bsize_idx >= SQR_BLOCK_SIZES
               ? BLOCK_INVALID
               : subsize_lookup[partition][sqr_bsize_idx];
  }
}